

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedMessageOrGroup<true,false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort type_card;
  TcParseTableBase *pTVar1;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  FieldEntry *pFVar6;
  string *psVar7;
  void *x;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 table_00;
  MessageLite *pMVar8;
  ushort *p;
  ulong uVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  char *pcVar10;
  uint *puVar11;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  size_type sVar13;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *extraout_RDX_01;
  ParseContext *ctx_00;
  undefined8 uVar14;
  int v1;
  ParseContext *delta;
  pointer pcVar15;
  uint local_74;
  TcParseTableBase *local_70;
  MessageLite *local_68;
  uint64_t local_60;
  undefined8 local_58;
  uint32_t next_tag;
  uint local_44;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_40;
  ParseContext *local_38;
  
  local_70 = table;
  local_68 = msg;
  local_60 = hasbits;
  pFVar6 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  type_card = pFVar6->type_card;
  local_58 = (ParseContext *)(CONCAT44(local_58._4_4_,(uint)type_card) & 0xffffffff00000030);
  local_74 = CONCAT22(local_74._2_2_,0x20);
  psVar7 = absl::lts_20240722::log_internal::Check_EQImpl<int,unsigned_short>
                     ((int *)&local_58,(unsigned_short *)&local_74,
                      "type_card & field_layout::kFcMask == static_cast<uint16_t>(field_layout::kFcRepeated)"
                     );
  if (psVar7 == (string *)0x0) {
    local_58 = (ParseContext *)(CONCAT44(local_58._4_4_,(uint)type_card) & 0xffffffff000001c0);
    local_74 = local_74 & 0xffff0000;
    psVar7 = absl::lts_20240722::log_internal::Check_EQImpl<int,unsigned_short>
                       ((int *)&local_58,(unsigned_short *)&local_74,
                        "type_card & field_layout::kRepMask == static_cast<uint16_t>(field_layout::kRepMessage)"
                       );
    pMVar8 = local_68;
    pTVar1 = local_70;
    if (psVar7 == (string *)0x0) {
      if ((data.field_0._0_4_ & 7) == 2) {
        local_40 = data.field_0;
        x = MaybeGetSplitBase(local_68,true,local_70);
        local_38 = (ParseContext *)
                   MaybeCreateRepeatedRefAt<google::protobuf::internal::RepeatedPtrFieldBase,true>
                             (x,(ulong)pFVar6->offset,pMVar8);
        aVar2 = local_40;
        aVar12.data = (long)&pTVar1->has_bits_offset + (ulong)pTVar1->aux_offset;
        table_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   GetTableFromAux(type_card,*(FieldAux *)(aVar12.data + (ulong)pFVar6->aux_idx * 8)
                                  );
        do {
          delta = local_38;
          pMVar8 = AddMessage((TcParseTableBase *)table_00,(RepeatedPtrFieldBase *)local_38);
          local_58 = (ParseContext *)ptr;
          uVar4 = ReadSize((char **)&local_58);
          ctx_00 = local_58;
          if ((local_58 == (ParseContext *)0x0) || (ctx->depth_ < 1)) {
LAB_001589d8:
            pcVar10 = Error(local_68,(char *)delta,ctx_00,(TcFieldData)aVar12,local_70,local_60);
            return pcVar10;
          }
          aVar12.data._4_4_ = 0;
          aVar12.data._0_4_ = uVar4;
          EpsCopyInputStream::PushLimit((EpsCopyInputStream *)&local_74,(char *)ctx,(int)local_58);
          uVar5 = local_74;
          v1 = ctx->depth_ + -1;
          ctx->depth_ = v1;
          ctx_00 = extraout_RDX;
          delta = local_58;
          if (local_58 == (ParseContext *)0x0) goto LAB_001589d8;
          aVar12 = table_00;
          p = (ushort *)
              ParseLoopPreserveNone(pMVar8,(char *)local_58,ctx,(TcParseTableBase *)table_00);
          if (p != (ushort *)0x0) {
            psVar7 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                               (v1,ctx->depth_,"old_depth == depth_");
            if (psVar7 != (string *)0x0) {
              pcVar15 = (psVar7->_M_dataplus)._M_p;
              sVar13 = psVar7->_M_string_length;
              pcVar10 = 
              "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
              ;
              uVar14 = 1099;
              goto LAB_00158a82;
            }
          }
          ctx->depth_ = ctx->depth_ + 1;
          local_44 = uVar5;
          delta = (ParseContext *)&stack0xffffffffffffffbc;
          bVar3 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)delta);
          ctx_00 = extraout_RDX_00;
          if ((!bVar3) || (p == (ushort *)0x0)) goto LAB_001589d8;
          if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_001589fa;
          delta = (ParseContext *)&next_tag;
          ptr = ReadTag((char *)p,(uint32_t *)delta,0);
          ctx_00 = extraout_RDX_01;
          if ((ParseContext *)ptr == (ParseContext *)0x0) goto LAB_001589d8;
        } while (next_tag == (uint32_t)aVar2.data);
        if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) {
LAB_001589fa:
          if (local_70->has_bits_offset != 0) {
            puVar11 = RefAt<unsigned_int>(local_68,(ulong)local_70->has_bits_offset);
            *puVar11 = *puVar11 | (uint)local_60;
          }
          return (char *)p;
        }
        uVar5 = (uint)local_70->fast_idx_mask & (uint)*p;
        if ((uVar5 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar9 = (ulong)(uVar5 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)*p ^ *(ulong *)(&local_70[1].fast_idx_mask + uVar9 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&local_70[1].has_bits_offset + uVar9);
        ptr = (char *)p;
      }
      else {
        UNRECOVERED_JUMPTABLE = local_70->fallback;
      }
      pcVar10 = (*UNRECOVERED_JUMPTABLE)(local_68,ptr,ctx,data,local_70,local_60);
      return pcVar10;
    }
    pcVar15 = (psVar7->_M_dataplus)._M_p;
    sVar13 = psVar7->_M_string_length;
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    uVar14 = 0x959;
  }
  else {
    pcVar15 = (psVar7->_M_dataplus)._M_p;
    sVar13 = psVar7->_M_string_length;
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
    ;
    uVar14 = 0x952;
  }
LAB_00158a82:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_58,pcVar10,uVar14,sVar13,pcVar15);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

const char* TcParser::MpRepeatedMessageOrGroup(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  ABSL_DCHECK_EQ(type_card & field_layout::kFcMask,
                 static_cast<uint16_t>(field_layout::kFcRepeated));
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Validate wiretype:
  if (!is_group) {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepMessage));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  } else {
    ABSL_DCHECK_EQ(type_card & field_layout::kRepMask,
                   static_cast<uint16_t>(field_layout::kRepGroup));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  RepeatedPtrFieldBase& field =
      MaybeCreateRepeatedRefAt<RepeatedPtrFieldBase, is_split>(
          base, entry.offset, msg);
  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));

  const char* ptr2 = ptr;
  uint32_t next_tag;
  do {
    MessageLite* value = AddMessage(inner_table, field);
    const auto inner_loop = [&](const char* ptr) {
      return ParseLoopPreserveNone(value, ptr, ctx, inner_table);
    };
    ptr = is_group ? ctx->ParseGroupInlined(ptr2, decoded_tag, inner_loop)
                   : ctx->ParseLengthDelimitedInlined(ptr2, inner_loop);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}